

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O3

void __thiscall embree::Stream<embree::Token>::drop(Stream<embree::Token> *this)

{
  size_t sVar1;
  size_t sVar2;
  runtime_error *this_00;
  uint uVar3;
  ParseLocation l;
  ParseLocation local_e0;
  Token local_c0;
  pair<embree::Token,_embree::ParseLocation> local_78;
  
  sVar2 = this->future;
  if (sVar2 == 0) {
    (*(this->super_RefCount)._vptr_RefCount[5])(&local_e0,this);
    (*(this->super_RefCount)._vptr_RefCount[4])(&local_c0,this);
    std::pair<embree::Token,_embree::ParseLocation>::
    pair<embree::Token_&,_embree::ParseLocation_&,_true>(&local_78,&local_c0,&local_e0);
    if (local_c0.loc.fileName.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.loc.fileName.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.str._M_dataplus._M_p != &local_c0.str.field_2) {
      operator_delete(local_c0.str._M_dataplus._M_p);
    }
    if (local_e0.fileName.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.fileName.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    sVar2 = this->past;
    sVar1 = this->future;
    if (sVar1 + sVar2 == 0x400) {
      if (sVar2 == 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"stream buffer empty");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar3 = (int)this->start + 1U & 0x3ff;
      this->start = (ulong)uVar3;
      sVar2 = sVar2 - 1;
      this->past = sVar2;
    }
    else {
      uVar3 = (uint)this->start;
    }
    this->future = sVar1 + 1;
    std::pair<embree::Token,_embree::ParseLocation>::operator=
              ((this->buffer).
               super__Vector_base<std::pair<embree::Token,_embree::ParseLocation>,_std::allocator<std::pair<embree::Token,_embree::ParseLocation>_>_>
               ._M_impl.super__Vector_impl_data._M_start + ((int)sVar2 + uVar3 + (int)sVar1 & 0x3ff)
               ,&local_78);
    if (local_78.second.fileName.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.second.fileName.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_78.first.loc.fileName.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.first.loc.fileName.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.first.str._M_dataplus._M_p != &local_78.first.str.field_2) {
      operator_delete(local_78.first.str._M_dataplus._M_p);
    }
    sVar2 = this->future;
  }
  this->past = this->past + 1;
  this->future = sVar2 - 1;
  return;
}

Assistant:

void drop() {
      if (future == 0) push_back(nextHelper());
      past++; future--;
    }